

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint32_t leveldb::Hash(char *data,size_t n,uint32_t seed)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  pbVar1 = (byte *)(data + n);
  uVar2 = (int)n * -0x395b586d ^ seed;
  pbVar3 = (byte *)data;
  if (3 < (long)n) {
    do {
      uVar2 = (uVar2 + *(int *)pbVar3) * -0x395b586d;
      uVar2 = uVar2 >> 0x10 ^ uVar2;
      data = (char *)(pbVar3 + 4);
      pbVar4 = pbVar3 + 8;
      pbVar3 = (byte *)data;
    } while (pbVar4 <= pbVar1);
  }
  lVar5 = (long)pbVar1 - (long)data;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      if (lVar5 != 3) goto LAB_006579c9;
      uVar2 = uVar2 + (uint)((byte *)data)[2] * 0x10000;
    }
    uVar2 = uVar2 + (uint)((byte *)data)[1] * 0x100;
  }
  uVar2 = ((byte)*data + uVar2) * -0x395b586d;
  uVar2 = uVar2 >> 0x18 ^ uVar2;
LAB_006579c9:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

uint32_t Hash(const char* data, size_t n, uint32_t seed) {
  // Similar to murmur hash
  const uint32_t m = 0xc6a4a793;
  const uint32_t r = 24;
  const char* limit = data + n;
  uint32_t h = seed ^ (n * m);

  // Pick up four bytes at a time
  while (data + 4 <= limit) {
    uint32_t w = DecodeFixed32(data);
    data += 4;
    h += w;
    h *= m;
    h ^= (h >> 16);
  }

  // Pick up remaining bytes
  switch (limit - data) {
    case 3:
      h += static_cast<uint8_t>(data[2]) << 16;
      FALLTHROUGH_INTENDED;
    case 2:
      h += static_cast<uint8_t>(data[1]) << 8;
      FALLTHROUGH_INTENDED;
    case 1:
      h += static_cast<uint8_t>(data[0]);
      h *= m;
      h ^= (h >> r);
      break;
  }
  return h;
}